

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> * __thiscall
spvtools::opt::LoopDescriptor::GetLoopsInBinaryLayoutOrder
          (vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
           *__return_storage_ptr__,LoopDescriptor *this)

{
  Function *pFVar1;
  pointer puVar2;
  uint32_t uVar3;
  Loop *pLVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var5
  ;
  size_t i;
  ulong index;
  pointer puVar6;
  uint32_t block_id;
  Loop *local_58;
  uint32_t local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  for (index = 0;
      index < (ulong)((long)(this->loops_).
                            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->loops_).
                            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); index = index + 1) {
    pLVar4 = GetLoopByIndex(this,index);
    uVar3 = BasicBlock::id(pLVar4->loop_header_);
    local_58 = (Loop *)CONCAT44(local_58._4_4_,uVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,(uint *)&local_58);
  }
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    pLVar4 = GetLoopByIndex(this,0);
    pFVar1 = pLVar4->loop_header_->function_;
    puVar2 = (pFVar1->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (pFVar1->blocks_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1)
    {
      local_4c = BasicBlock::id((puVar6->_M_t).
                                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                                _M_head_impl);
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        (local_48._M_impl.super__Vector_impl_data._M_start,
                         local_48._M_impl.super__Vector_impl_data._M_finish,&local_4c);
      if (_Var5._M_current != local_48._M_impl.super__Vector_impl_data._M_finish) {
        local_58 = GetLoopByIndex(this,(long)_Var5._M_current -
                                       (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2)
        ;
        std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
        emplace_back<spvtools::opt::Loop*>
                  ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                   __return_storage_ptr__,&local_58);
      }
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Loop*> LoopDescriptor::GetLoopsInBinaryLayoutOrder() {
  std::vector<uint32_t> ids{};

  for (size_t i = 0; i < NumLoops(); ++i) {
    ids.push_back(GetLoopByIndex(i).GetHeaderBlock()->id());
  }

  std::vector<Loop*> loops{};
  if (!ids.empty()) {
    auto function = GetLoopByIndex(0).GetHeaderBlock()->GetParent();
    for (const auto& block : *function) {
      auto block_id = block.id();

      auto element = std::find(std::begin(ids), std::end(ids), block_id);
      if (element != std::end(ids)) {
        loops.push_back(&GetLoopByIndex(element - std::begin(ids)));
      }
    }
  }

  return loops;
}